

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O0

void __thiscall SerialExecutionQueue::killAfterTimeout(SerialExecutionQueue *this)

{
  char *pcVar1;
  int local_3c;
  duration<long,_std::ratio<1L,_1L>_> local_38;
  int local_2c;
  duration<long,_std::ratio<1L,_1000L>_> local_28;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  SerialExecutionQueue *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_20,&this->queueCompleteMutex);
  if ((this->queueComplete & 1U) == 0) {
    pcVar1 = getenv("LLBUILD_TEST");
    if (pcVar1 == (char *)0x0) {
      local_3c = 10;
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1l>> *)&local_38,&local_3c);
      std::condition_variable::wait_for<long,std::ratio<1l,1l>>
                (&this->queueCompleteCondition,(unique_lock<std::mutex> *)local_20,&local_38);
    }
    else {
      local_2c = 1000;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000l>> *)&local_28,&local_2c);
      std::condition_variable::wait_for<long,std::ratio<1l,1000l>>
                (&this->queueCompleteCondition,(unique_lock<std::mutex> *)local_20,&local_28);
    }
    llbuild::basic::ProcessGroup::signalAll(&this->spawnedProcesses,9);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return;
}

Assistant:

void killAfterTimeout() {
    std::unique_lock<std::mutex> lock(queueCompleteMutex);

    if (!queueComplete) {
      // Shorten timeout if in testing context
      if (getenv("LLBUILD_TEST") != nullptr) {
        queueCompleteCondition.wait_for(lock, std::chrono::milliseconds(1000));
      } else {
        queueCompleteCondition.wait_for(lock, std::chrono::seconds(10));
      }

#if _WIN32
      spawnedProcesses.signalAll(SIGTERM);
#else
      spawnedProcesses.signalAll(SIGKILL);
#endif
    }
  }